

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O1

int anon_unknown.dwarf_b76b::CheckHeader(FILE *fp)

{
  ulong in_RAX;
  char *__s;
  char data_check [5];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  fread((void *)((long)&uStack_18 + 3),1,4,(FILE *)fp);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  if (uStack_18._3_4_ == 0x46464952) {
    fseek((FILE *)fp,4,1);
    fread((void *)((long)&uStack_18 + 3),1,4,(FILE *)fp);
    if (uStack_18._7_1_ == '\0' && uStack_18._3_4_ == 0x45564157) {
      fread((void *)((long)&uStack_18 + 3),1,4,(FILE *)fp);
      if (uStack_18._7_1_ == '\0' && uStack_18._3_4_ == 0x20746d66) {
        fread((void *)((long)&uStack_18 + 3),1,4,(FILE *)fp);
        __s = "fmt (2) error.";
        if ((((uStack_18._3_1_ == '\x10') && (uStack_18._4_1_ == '\0')) && (uStack_18._5_1_ == '\0')
            ) && (uStack_18._6_1_ == '\0')) {
          fread((void *)((long)&uStack_18 + 3),1,2,(FILE *)fp);
          __s = "Format ID error.";
          if ((uStack_18._3_1_ == '\x01') && (uStack_18._4_1_ == '\0')) {
            fread((void *)((long)&uStack_18 + 3),1,2,(FILE *)fp);
            __s = "This function cannot support stereo file";
            if ((uStack_18._3_1_ == '\x01') && (uStack_18._4_1_ == '\0')) {
              return 1;
            }
          }
        }
      }
      else {
        __s = "fmt error.";
      }
    }
    else {
      __s = "WAVE error.";
    }
  }
  else {
    __s = "RIFF error.";
  }
  puts(__s);
  return 0;
}

Assistant:

static int CheckHeader(FILE *fp) {
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "RIFF"
  data_check[4] = '\0';
  if (0 != strcmp(data_check, "RIFF")) {
    printf("RIFF error.\n");
    return 0;
  }
  fseek(fp, 4, SEEK_CUR);
  fread(data_check, 1, 4, fp);  // "WAVE"
  if (0 != strcmp(data_check, "WAVE")) {
    printf("WAVE error.\n");
    return 0;
  }
  fread(data_check, 1, 4, fp);  // "fmt "
  if (0 != strcmp(data_check, "fmt ")) {
    printf("fmt error.\n");
    return 0;
  }
  fread(data_check, 1, 4, fp);  // 1 0 0 0
  if (!(16 == data_check[0] && 0 == data_check[1] &&
      0 == data_check[2] && 0 == data_check[3])) {
    printf("fmt (2) error.\n");
    return 0;
  }
  fread(data_check, 1, 2, fp);  // 1 0
  if (!(1 == data_check[0] && 0 == data_check[1])) {
    printf("Format ID error.\n");
    return 0;
  }
  fread(data_check, 1, 2, fp);  // 1 0
  if (!(1 == data_check[0] && 0 == data_check[1])) {
    printf("This function cannot support stereo file\n");
    return 0;
  }
  return 1;
}